

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O3

void __thiscall
UnitTests::Assert::Equals<char[24],std::__cxx11::string>
          (Assert *this,char (*expected) [24],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  string local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  Equals<char[24],std::__cxx11::string>(this,&local_30,expected,actual);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                             local_30.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Equals(const T& expected, const U& actual) const
        {
            Equals(std::string(), expected, actual);
        }